

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O1

void __thiscall crnlib::mipmapped_texture::discard_mips(mipmapped_texture *this)

{
  mip_level *this_00;
  uint uVar1;
  ulong uVar2;
  vector<crnlib::mip_level_*> *pvVar3;
  ulong uVar4;
  
  if ((this->m_faces).m_size != 0) {
    uVar4 = 0;
    do {
      if (1 < (this->m_faces).m_p[uVar4].m_size) {
        pvVar3 = (this->m_faces).m_p;
        uVar1 = pvVar3[uVar4].m_size;
        pvVar3 = pvVar3 + uVar4;
        if (1 < uVar1) {
          uVar2 = 1;
          do {
            this_00 = pvVar3->m_p[uVar2];
            if (this_00 != (mip_level *)0x0) {
              mip_level::~mip_level(this_00);
              crnlib_free(this_00);
            }
            uVar2 = uVar2 + 1;
            pvVar3 = (this->m_faces).m_p;
            uVar1 = pvVar3[uVar4].m_size;
            pvVar3 = pvVar3 + uVar4;
          } while (uVar2 < uVar1);
        }
        if (uVar1 != 1) {
          if (uVar1 == 0) {
            if (pvVar3->m_capacity == 0) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)pvVar3,1,true,8,(object_mover)0x0,false);
            }
            memset(pvVar3->m_p + pvVar3->m_size,0,(ulong)(1 - pvVar3->m_size) << 3);
          }
          pvVar3->m_size = 1;
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (this->m_faces).m_size);
  }
  return;
}

Assistant:

void mipmapped_texture::discard_mips() {
  for (uint f = 0; f < m_faces.size(); f++) {
    if (m_faces[f].size() > 1) {
      for (uint l = 1; l < m_faces[f].size(); l++)
        crnlib_delete(m_faces[f][l]);

      m_faces[f].resize(1);
    }
  }

  CRNLIB_ASSERT(check());
}